

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login_message_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::LoginMessageTest_returns_given_values_Test::
LoginMessageTest_returns_given_values_Test(LoginMessageTest_returns_given_values_Test *this)

{
  LoginMessageTest_returns_given_values_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__LoginMessageTest_returns_given_values_Test_003d74e8;
  return;
}

Assistant:

TEST(LoginMessageTest, returns_given_values)
{
    EXPECT_EQ(USERNAME, login_message.GetUsername());
    EXPECT_EQ(PASSWORD, login_message.GetPassword());
    EXPECT_EQ(APPLICATION, login_message.GetApplication());
    EXPECT_EQ(APPLICATION_VERSION, login_message.GetApplicationVersion());
    EXPECT_EQ(ALIAS, login_message.GetAlias());
    EXPECT_EQ(API, login_message.GetApi());
    EXPECT_EQ(API_VERSION, login_message.GetApiVersion());
    EXPECT_EQ("BidFXCpp", login_message.GetProduct());
    EXPECT_EQ(PRODUCT_SERIAL_NUMBER, login_message.GetProductSerialNumber());
}